

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandFlowRetime(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pNtk_01;
  char *pcVar2;
  int local_68;
  uint local_64;
  int maxDelay;
  int fFastButConservative;
  int fBlockConst;
  int fGuaranteeInit;
  int fComputeInit;
  int fVerbose;
  int fBackward;
  int fForward;
  int nMaxIters;
  int c;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  local_64 = 0;
  fComputeInit = 0;
  fBlockConst = 1;
  fFastButConservative = 0;
  fGuaranteeInit = 0;
  maxDelay = 0;
  fBackward = 999;
  local_68 = 0;
  Extra_UtilGetoptReset();
LAB_0023381a:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"MDfcgbkivh");
    if (iVar1 == -1) {
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      if ((fVerbose != 0) && (fComputeInit != 0)) {
        Abc_Print(-1,"Only one switch \"-f\" or \"-b\" can be selected at a time.\n");
        return 1;
      }
      if ((fFastButConservative != 0) && (fBlockConst == 0)) {
        Abc_Print(-1,"Initial state guarantee (-g) requires initial state computation (-i).\n");
        return 1;
      }
      iVar1 = Abc_NtkLatchNum(pNtk_00);
      if (iVar1 == 0) {
        Abc_Print(-1,"The network has no latches. Retiming is not performed.\n");
        return 0;
      }
      iVar1 = Abc_NtkGetChoiceNum(pNtk_00);
      if (iVar1 != 0) {
        Abc_Print(-1,"Retiming with choice nodes is not implemented.\n");
        return 0;
      }
      pNtk_01 = Abc_FlowRetime_MinReg
                          (pNtk_00,fGuaranteeInit,fBlockConst,fFastButConservative,maxDelay,fVerbose
                           ,fComputeInit,fBackward,local_68,local_64);
      if (pNtk_01 != pNtk_00) {
        Abc_FrameReplaceCurrentNetwork(pAbc,pNtk_01);
      }
      return 0;
    }
    switch(iVar1) {
    case 0x44:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by a positive integer.\n");
        goto LAB_00233abb;
      }
      local_68 = atoi(argv[globalUtilOptind]);
      iVar1 = local_68;
      break;
    default:
      goto LAB_00233abb;
    case 0x4d:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-M\" should be followed by a positive integer.\n");
        goto LAB_00233abb;
      }
      fBackward = atoi(argv[globalUtilOptind]);
      iVar1 = fBackward;
      break;
    case 0x62:
      fComputeInit = fComputeInit ^ 1;
      goto LAB_0023381a;
    case 99:
      local_64 = local_64 ^ 1;
      goto LAB_0023381a;
    case 0x66:
      fVerbose = fVerbose ^ 1;
      goto LAB_0023381a;
    case 0x67:
      fFastButConservative = fFastButConservative ^ 1;
      goto LAB_0023381a;
    case 0x68:
      goto LAB_00233abb;
    case 0x69:
      fBlockConst = fBlockConst ^ 1;
      goto LAB_0023381a;
    case 0x6b:
      maxDelay = maxDelay ^ 1;
      goto LAB_0023381a;
    case 0x76:
      fGuaranteeInit = fGuaranteeInit ^ 1;
      goto LAB_0023381a;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_00233abb:
      Abc_Print(-2,"usage: fretime [-M num] [-D num] [-fbvih]\n");
      Abc_Print(-2,"\t         retimes the current network using flow-based algorithm\n");
      Abc_Print(-2,"\t-M num : the maximum number of iterations [default = %d]\n",
                (ulong)(uint)fBackward);
      Abc_Print(-2,"\t-D num : the maximum delay [default = none]\n");
      pcVar2 = "no";
      if (fBlockConst != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-i     : enables init state computation [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (maxDelay != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-k     : blocks retiming over const nodes [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (fFastButConservative != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-g     : guarantees init state computation [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (local_64 != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-c     : very fast (but conserv.) delay constraints [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (fVerbose != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-f     : enables forward-only retiming  [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (fComputeInit != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-b     : enables backward-only retiming [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (fGuaranteeInit != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v     : enables verbose output [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandFlowRetime( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, nMaxIters;
    int fForward;
    int fBackward;
    int fVerbose;
    int fComputeInit, fGuaranteeInit, fBlockConst;
    int fFastButConservative;
    int maxDelay;

    extern Abc_Ntk_t* Abc_FlowRetime_MinReg( Abc_Ntk_t * pNtk, int fVerbose,
                                             int fComputeInit, int fGuaranteeInit, int fBlockConst,
                                             int fForward, int fBackward, int nMaxIters,
                                             int maxDelay, int fFastButConservative);

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fForward  =  0;
    fFastButConservative = 0;
    fBackward =  0;
    fComputeInit =  1;
    fGuaranteeInit =  0;
    fVerbose  =  0;
    fBlockConst  =  0;
    nMaxIters = 999;
    maxDelay  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "MDfcgbkivh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nMaxIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nMaxIters < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a positive integer.\n" );
                goto usage;
            }
            maxDelay = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( maxDelay < 0 )
                goto usage;
           break;
        case 'f':
            fForward ^= 1;
            break;
        case 'c':
            fFastButConservative ^= 1;
            break;
        case 'i':
            fComputeInit ^= 1;
            break;
        case 'b':
            fBackward ^= 1;
            break;
        case 'g':
            fGuaranteeInit ^= 1;
            break;
        case 'k':
            fBlockConst ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( fForward && fBackward )
    {
        Abc_Print( -1, "Only one switch \"-f\" or \"-b\" can be selected at a time.\n" );
        return 1;
    }

    if ( fGuaranteeInit && !fComputeInit )
    {
      Abc_Print( -1, "Initial state guarantee (-g) requires initial state computation (-i).\n" );
      return 1;
    }

    if ( !Abc_NtkLatchNum(pNtk) )
    {
        Abc_Print( -1, "The network has no latches. Retiming is not performed.\n" );
        return 0;
    }

    if ( Abc_NtkGetChoiceNum(pNtk) )
      {
        Abc_Print( -1, "Retiming with choice nodes is not implemented.\n" );
        return 0;
      }

    // perform the retiming
    pNtkRes = Abc_FlowRetime_MinReg( pNtk, fVerbose, fComputeInit,
                                     fGuaranteeInit, fBlockConst,
                                     fForward, fBackward,
                                     nMaxIters, maxDelay, fFastButConservative );

    if (pNtkRes != pNtk)
      Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );

    return 0;

usage:
    Abc_Print( -2, "usage: fretime [-M num] [-D num] [-fbvih]\n" );
    Abc_Print( -2, "\t         retimes the current network using flow-based algorithm\n" );
    Abc_Print( -2, "\t-M num : the maximum number of iterations [default = %d]\n", nMaxIters );
    Abc_Print( -2, "\t-D num : the maximum delay [default = none]\n" );
    Abc_Print( -2, "\t-i     : enables init state computation [default = %s]\n", fComputeInit? "yes": "no" );
    Abc_Print( -2, "\t-k     : blocks retiming over const nodes [default = %s]\n", fBlockConst? "yes": "no" );
    Abc_Print( -2, "\t-g     : guarantees init state computation [default = %s]\n", fGuaranteeInit? "yes": "no" );
    Abc_Print( -2, "\t-c     : very fast (but conserv.) delay constraints [default = %s]\n", fFastButConservative? "yes": "no" );
    Abc_Print( -2, "\t-f     : enables forward-only retiming  [default = %s]\n", fForward? "yes": "no" );
    Abc_Print( -2, "\t-b     : enables backward-only retiming [default = %s]\n", fBackward? "yes": "no" );
    Abc_Print( -2, "\t-v     : enables verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}